

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

int QSslCertificate::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  QTlsBackend *pQVar2;
  QMessageLogger *this;
  long in_FS_OFFSET;
  X509ChainVerifyPtr verifyPtr;
  QTlsBackend *tlsBackend;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff58;
  int iVar3;
  EVP_PKEY_CTX *file;
  QMessageLogger *in_stack_ffffffffffffff70;
  char local_68 [32];
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = ctx;
  pQVar2 = QTlsBackend::activeOrAnyBackend();
  if (pQVar2 == (QTlsBackend *)0x0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)ctx,in_stack_ffffffffffffff58);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x26eb51);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff70,(char *)file,(int)((ulong)ctx >> 0x20),
                 (char *)in_stack_ffffffffffffff58,(char *)0x26eb67);
      QMessageLogger::warning(local_48);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    memset(ctx,0,0x18);
    iVar3 = (int)file;
    QList<QSslError>::QList((QList<QSslError> *)0x26eb9f);
  }
  else {
    this = (QMessageLogger *)(**(code **)(*(long *)pQVar2 + 0xe0))();
    if (this == (QMessageLogger *)0x0) {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)ctx,in_stack_ffffffffffffff58);
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        if (!bVar1) break;
        anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x26ec16);
        QMessageLogger::QMessageLogger
                  (this,(char *)file,(int)((ulong)ctx >> 0x20),(char *)in_stack_ffffffffffffff58,
                   (char *)0x26ec2c);
        QMessageLogger::warning(local_68);
        local_20 = local_20 & 0xffffffffffffff00;
      }
      memset(ctx,0,0x18);
      iVar3 = (int)file;
      QList<QSslError>::QList((QList<QSslError> *)0x26ec64);
    }
    else {
      (*(code *)this)(ctx,sig,siglen);
      iVar3 = (int)file;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslError> QSslCertificate::verify(const QList<QSslCertificate> &certificateChain, const QString &hostName)
{
    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return {};
    }
    auto verifyPtr = tlsBackend->X509Verifier();
    if (!verifyPtr) {
        qCWarning(lcSsl, "Available TLS backend does not support manual certificate verification");
        return {};
    }
    return verifyPtr(certificateChain, hostName);
}